

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_MobjTarget(FParser *this)

{
  bool bVar1;
  AActor *pAVar2;
  TObjPtr<AActor> local_28;
  AActor *local_20;
  AActor *target;
  AActor *mo;
  FParser *this_local;
  
  mo = (AActor *)this;
  bVar1 = CheckArgs(this,1);
  if (bVar1) {
    target = actorvalue(this->t_argv);
    if ((((1 < this->t_argc) && (local_20 = actorvalue(this->t_argv + 1), target != (AActor *)0x0))
        && (local_20 != (AActor *)0x0)) && (target->SeeState != (FState *)0x0)) {
      TObjPtr<AActor>::operator=(&target->target,local_20);
      AActor::SetState(target,target->SeeState,false);
      TFlags<ActorFlag,_unsigned_int>::operator|=(&target->flags,MF_JUSTHIT);
    }
    (this->t_return).type = 2;
    if (target == (AActor *)0x0) {
      TObjPtr<AActor>::TObjPtr(&local_28,(AActor *)0x0);
    }
    else {
      TObjPtr<AActor>::TObjPtr(&local_28,&target->target);
    }
    pAVar2 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&local_28);
    (this->t_return).value.mobj = pAVar2;
  }
  return;
}

Assistant:

void FParser::SF_MobjTarget(void)
{
	AActor*  mo;
	AActor*  target;
	
	if (CheckArgs(1))
	{
		mo = actorvalue(t_argv[0]);
		if(t_argc > 1)
		{
			target = actorvalue(t_argv[1]);
			if(mo && target && mo->SeeState) // haleyjd: added target check -- no NULL allowed
			{
				mo->target=target;
				mo->SetState(mo->SeeState);
				mo->flags|=MF_JUSTHIT;
			}
		}
		
		t_return.type = svt_mobj;
		t_return.value.mobj = mo ? mo->target : NULL;
	}
}